

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O1

void __thiscall
AddressFactory_CreateTaprootAddress_Test::TestBody(AddressFactory_CreateTaprootAddress_Test *this)

{
  long *plVar1;
  bool bVar2;
  char *pcVar3;
  AssertionResult gtest_ar_2;
  ScriptBuilder build;
  SchnorrPubkey pubkey;
  TaprootScriptTree tree;
  AddressFactory factory;
  Address addr;
  AssertHelper local_410;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_408;
  AssertHelper local_400;
  ScriptBuilder local_3f8;
  SchnorrPubkey local_3d8;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [16];
  pointer local_390;
  pointer local_378;
  pointer local_360;
  TapBranch local_348;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_2d0;
  Script local_2b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_278;
  undefined1 local_248 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_240 [14];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_1d0;
  AddressFactory local_1b8;
  Address local_190;
  
  cfd::AddressFactory::AddressFactory(&local_1b8);
  cfd::core::Address::Address(&local_190);
  plVar1 = (long *)(local_3c0 + 0x10);
  local_3c0._0_8_ = plVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3c0,"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
             "");
  cfd::core::SchnorrPubkey::SchnorrPubkey(&local_3d8,(string *)local_3c0);
  if ((long *)local_3c0._0_8_ != plVar1) {
    operator_delete((void *)local_3c0._0_8_);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::CreateTaprootAddress((Address *)local_3c0,&local_1b8,&local_3d8);
      cfd::core::Address::operator=(&local_190,(Address *)local_3c0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_278);
      cfd::core::Script::~Script(&local_2b8);
      local_348._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_2d0);
      cfd::core::TapBranch::~TapBranch(&local_348);
      if (local_360 != (pointer)0x0) {
        operator_delete(local_360);
      }
      if (local_378 != (pointer)0x0) {
        operator_delete(local_378);
      }
      if (local_390 != (pointer)0x0) {
        operator_delete(local_390);
      }
      if ((undefined1 *)local_3c0._16_8_ != local_3a0) {
        operator_delete((void *)local_3c0._16_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_3c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x13e,
               "Expected: addr = factory.CreateTaprootAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_248,(Message *)local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_248);
    if ((long *)local_3c0._0_8_ != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_3c0._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_3c0._0_8_ + 8))();
      }
      local_3c0._0_8_ = (long *)0x0;
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_3c0,&local_190);
  testing::internal::CmpHelperEQ<char[63],std::__cxx11::string>
            ((internal *)local_248,
             "\"bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4\"",
             "addr.GetAddress()",
             (char (*) [63])"bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0);
  if ((long *)local_3c0._0_8_ != plVar1) {
    operator_delete((void *)local_3c0._0_8_);
  }
  if (local_248[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3c0);
    if (local_240[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_240[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x13f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3f8,(Message *)local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3f8);
    if ((long *)local_3c0._0_8_ != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_3c0._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_3c0._0_8_ + 8))();
      }
      local_3c0._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_240,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::SchnorrPubkey::GetByteData256((ByteData256 *)local_248,&local_3d8);
      cfd::AddressFactory::CreateTaprootAddress
                ((Address *)local_3c0,&local_1b8,(ByteData256 *)local_248);
      cfd::core::Address::operator=(&local_190,(Address *)local_3c0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_278);
      cfd::core::Script::~Script(&local_2b8);
      local_348._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_2d0);
      cfd::core::TapBranch::~TapBranch(&local_348);
      if (local_360 != (pointer)0x0) {
        operator_delete(local_360);
      }
      if (local_378 != (pointer)0x0) {
        operator_delete(local_378);
      }
      if (local_390 != (pointer)0x0) {
        operator_delete(local_390);
      }
      if ((undefined1 *)local_3c0._16_8_ != local_3a0) {
        operator_delete((void *)local_3c0._16_8_);
      }
      if (local_248 != (undefined1  [8])0x0) {
        operator_delete((void *)local_248);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_3c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x141,
               "Expected: addr = factory.CreateTaprootAddress(pubkey.GetByteData256()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_248,(Message *)local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_248);
    if ((long *)local_3c0._0_8_ != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_3c0._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_3c0._0_8_ + 8))();
      }
      local_3c0._0_8_ = (long *)0x0;
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_3c0,&local_190);
  testing::internal::CmpHelperEQ<char[63],std::__cxx11::string>
            ((internal *)local_248,
             "\"bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4\"",
             "addr.GetAddress()",
             (char (*) [63])"bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0);
  if ((long *)local_3c0._0_8_ != plVar1) {
    operator_delete((void *)local_3c0._0_8_);
  }
  if (local_248[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3c0);
    if (local_240[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_240[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x142,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3f8,(Message *)local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3f8);
    if ((long *)local_3c0._0_8_ != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_3c0._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_3c0._0_8_ + 8))();
      }
      local_3c0._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_240,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3f8._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_00733958;
  local_3f8.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3f8.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3f8.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::ScriptBuilder::AppendOperator
            (&local_3f8,(ScriptOperator *)cfd::core::ScriptOperator::OP_TRUE);
  cfd::core::ScriptBuilder::Build((Script *)local_3c0,&local_3f8);
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)local_248,(Script *)local_3c0);
  cfd::core::Script::~Script((Script *)local_3c0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::CreateTaprootAddress
                ((Address *)local_3c0,&local_1b8,(TaprootScriptTree *)local_248,&local_3d8);
      cfd::core::Address::operator=(&local_190,(Address *)local_3c0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_278);
      cfd::core::Script::~Script(&local_2b8);
      local_348._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_2d0);
      cfd::core::TapBranch::~TapBranch(&local_348);
      if (local_360 != (pointer)0x0) {
        operator_delete(local_360);
      }
      if (local_378 != (pointer)0x0) {
        operator_delete(local_378);
      }
      if (local_390 != (pointer)0x0) {
        operator_delete(local_390);
      }
      if ((undefined1 *)local_3c0._16_8_ != local_3a0) {
        operator_delete((void *)local_3c0._16_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_3c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x147,
               "Expected: addr = factory.CreateTaprootAddress(tree, pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_410,(Message *)local_3c0);
    testing::internal::AssertHelper::~AssertHelper(&local_410);
    if ((long *)local_3c0._0_8_ != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_3c0._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_3c0._0_8_ + 8))();
      }
      local_3c0._0_8_ = (long *)0x0;
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_3c0,&local_190);
  testing::internal::CmpHelperEQ<char[63],std::__cxx11::string>
            ((internal *)&local_410,
             "\"bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah\"",
             "addr.GetAddress()",
             (char (*) [63])"bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0);
  if ((long *)local_3c0._0_8_ != plVar1) {
    operator_delete((void *)local_3c0._0_8_);
  }
  if (local_410.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_3c0);
    if (local_408.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_408.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_400,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x148,pcVar3);
    testing::internal::AssertHelper::operator=(&local_400,(Message *)local_3c0);
    testing::internal::AssertHelper::~AssertHelper(&local_400);
    if ((long *)local_3c0._0_8_ != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_3c0._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_3c0._0_8_ + 8))();
      }
      local_3c0._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_408,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_248 = (undefined1  [8])&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1d0);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_248);
  local_3f8._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_00733958;
  if (local_3f8.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3f8.script_byte_array_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_3d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3d8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_190.format_data_);
  cfd::core::Script::~Script(&local_190.redeem_script_);
  local_190.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_190.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_190.script_tree_.super_TapBranch);
  if (local_190.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_190.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_190.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.address_._M_dataplus._M_p != &local_190.address_.field_2) {
    operator_delete(local_190.address_._M_dataplus._M_p);
  }
  local_1b8._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_00733578;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_1b8.prefix_list_);
  return;
}

Assistant:

TEST(AddressFactory, CreateTaprootAddress)
{
  AddressFactory factory;
  Address addr;
  const SchnorrPubkey pubkey = SchnorrPubkey(
    "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  EXPECT_NO_THROW(addr = factory.CreateTaprootAddress(pubkey));
  EXPECT_EQ("bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4", addr.GetAddress());

  EXPECT_NO_THROW(addr = factory.CreateTaprootAddress(pubkey.GetByteData256()));
  EXPECT_EQ("bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4", addr.GetAddress());

  ScriptBuilder build;
  build.AppendOperator(ScriptOperator::OP_TRUE);
  TaprootScriptTree tree(build.Build());
  EXPECT_NO_THROW(addr = factory.CreateTaprootAddress(tree, pubkey));
  EXPECT_EQ("bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah", addr.GetAddress());
}